

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Upsert * sqlite3UpsertNew(sqlite3 *db,ExprList *pTarget,Expr *pTargetWhere,ExprList *pSet,
                         Expr *pWhere,Upsert *pNext)

{
  Upsert *pNew;
  Upsert *pNext_local;
  Expr *pWhere_local;
  ExprList *pSet_local;
  Expr *pTargetWhere_local;
  ExprList *pTarget_local;
  sqlite3 *db_local;
  
  db_local = (sqlite3 *)sqlite3DbMallocZero(db,0x58);
  if (db_local == (sqlite3 *)0x0) {
    sqlite3ExprListDelete(db,pTarget);
    sqlite3ExprDelete(db,pTargetWhere);
    sqlite3ExprListDelete(db,pSet);
    sqlite3ExprDelete(db,pWhere);
    sqlite3UpsertDelete(db,pNext);
    db_local = (sqlite3 *)0x0;
  }
  else {
    db_local->pVfs = (sqlite3_vfs *)pTarget;
    db_local->pVdbe = (Vdbe *)pTargetWhere;
    db_local->pDfltColl = (CollSeq *)pSet;
    db_local->mutex = (sqlite3_mutex *)pWhere;
    *(bool *)&db_local->nDb = pSet != (ExprList *)0x0;
    db_local->aDb = (Db *)pNext;
  }
  return (Upsert *)db_local;
}

Assistant:

SQLITE_PRIVATE Upsert *sqlite3UpsertNew(
  sqlite3 *db,           /* Determines which memory allocator to use */
  ExprList *pTarget,     /* Target argument to ON CONFLICT, or NULL */
  Expr *pTargetWhere,    /* Optional WHERE clause on the target */
  ExprList *pSet,        /* UPDATE columns, or NULL for a DO NOTHING */
  Expr *pWhere,          /* WHERE clause for the ON CONFLICT UPDATE */
  Upsert *pNext          /* Next ON CONFLICT clause in the list */
){
  Upsert *pNew;
  pNew = sqlite3DbMallocZero(db, sizeof(Upsert));
  if( pNew==0 ){
    sqlite3ExprListDelete(db, pTarget);
    sqlite3ExprDelete(db, pTargetWhere);
    sqlite3ExprListDelete(db, pSet);
    sqlite3ExprDelete(db, pWhere);
    sqlite3UpsertDelete(db, pNext);
    return 0;
  }else{
    pNew->pUpsertTarget = pTarget;
    pNew->pUpsertTargetWhere = pTargetWhere;
    pNew->pUpsertSet = pSet;
    pNew->pUpsertWhere = pWhere;
    pNew->isDoUpdate = pSet!=0;
    pNew->pNextUpsert = pNext;
  }
  return pNew;
}